

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

void __thiscall
cplus::utils::Stack<cplus::lang::StringSet::TreeNode_**>::forEach
          (Stack<cplus::lang::StringSet::TreeNode_**> *this,
          function<void_(cplus::lang::StringSet::TreeNode_**&)> *func)

{
  TreeNode ***__args;
  StackPoint *local_20;
  StackPoint *state;
  function<void_(cplus::lang::StringSet::TreeNode_**&)> *func_local;
  Stack<cplus::lang::StringSet::TreeNode_**> *this_local;
  
  for (local_20 = this->state; local_20 != (StackPoint *)0x0; local_20 = StackPoint::prev(local_20))
  {
    __args = StackPoint::get(local_20);
    std::function<void_(cplus::lang::StringSet::TreeNode_**&)>::operator()(func,__args);
  }
  return;
}

Assistant:

void forEach(std::function<void(T &)> func) const {
				StackPoint *state = this->state;
				while (state != nullptr) {
					func(state->get());
					state = state->prev();
				}
			}